

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minunit.h
# Opt level: O1

double mu_timer_cpu(void)

{
  int iVar1;
  long lVar2;
  clock_t cVar3;
  double dVar4;
  timespec ts;
  rusage local_98;
  
  iVar1 = clock_gettime(2,(timespec *)&local_98);
  if (iVar1 == -1) {
    iVar1 = getrusage(RUSAGE_SELF,&local_98);
    if (iVar1 == -1) {
      lVar2 = sysconf(2);
      cVar3 = times((tms *)&local_98);
      if (cVar3 == -1) {
        cVar3 = clock();
        if (cVar3 == -1) {
          dVar4 = -1.0;
        }
        else {
          dVar4 = (double)cVar3 / 1000000.0;
        }
      }
      else {
        dVar4 = (double)local_98.ru_utime.tv_sec / (double)lVar2;
      }
    }
    else {
      dVar4 = (double)local_98.ru_utime.tv_usec / 1000000.0 + (double)local_98.ru_utime.tv_sec;
    }
  }
  else {
    dVar4 = (double)local_98.ru_utime.tv_usec / 1000000000.0 + (double)local_98.ru_utime.tv_sec;
  }
  return dVar4;
}

Assistant:

static double mu_timer_cpu(void) {
#if defined(_WIN32)
  /* Windows -------------------------------------------------- */
  FILETIME createTime;
  FILETIME exitTime;
  FILETIME kernelTime;
  FILETIME userTime;

  /* This approach has a resolution of 1/64 second. Unfortunately, Windows' API
   * does not offer better */
  if (GetProcessTimes(GetCurrentProcess(), &createTime, &exitTime, &kernelTime,
                      &userTime) != 0) {
    ULARGE_INTEGER userSystemTime;
    memcpy(&userSystemTime, &userTime, sizeof(ULARGE_INTEGER));
    return (double)userSystemTime.QuadPart / 10000000.0;
  }

#elif defined(__unix__) || defined(__unix) || defined(unix) ||                 \
    (defined(__APPLE__) && defined(__MACH__))
  /* AIX, BSD, Cygwin, HP-UX, Linux, OSX, and Solaris --------- */

#if defined(_POSIX_TIMERS) && (_POSIX_TIMERS > 0)
  /* Prefer high-res POSIX timers, when available. */
  {
    clockid_t id;
    struct timespec ts;
#if _POSIX_CPUTIME > 0
    /* Clock ids vary by OS.  Query the id, if possible. */
    if (clock_getcpuclockid(0, &id) == -1)
#endif
#if defined(CLOCK_PROCESS_CPUTIME_ID)
      /* Use known clock id for AIX, Linux, or Solaris. */
      id = CLOCK_PROCESS_CPUTIME_ID;
#elif defined(CLOCK_VIRTUAL)
    /* Use known clock id for BSD or HP-UX. */
    id = CLOCK_VIRTUAL;
#else
    id = (clockid_t)-1;
#endif
    if (id != (clockid_t)-1 && clock_gettime(id, &ts) != -1)
      return (double)ts.tv_sec + (double)ts.tv_nsec / 1000000000.0;
  }
#endif

#if defined(RUSAGE_SELF)
  {
    struct rusage rusage;
    if (getrusage(RUSAGE_SELF, &rusage) != -1)
      return (double)rusage.ru_utime.tv_sec +
             (double)rusage.ru_utime.tv_usec / 1000000.0;
  }
#endif

#if defined(_SC_CLK_TCK)
  {
    const double ticks = (double)sysconf(_SC_CLK_TCK);
    struct tms tms;
    if (times(&tms) != (clock_t)-1)
      return (double)tms.tms_utime / ticks;
  }
#endif

#if defined(CLOCKS_PER_SEC)
  {
    clock_t cl = clock();
    if (cl != (clock_t)-1)
      return (double)cl / (double)CLOCKS_PER_SEC;
  }
#endif

#endif

  return -1; /* Failed. */
}